

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPServer.hpp
# Opt level: O2

Response *
webfront::http::Response::getStatusResponse(Response *__return_storage_ptr__,StatusCode code)

{
  StatusCode in_DX;
  StatusCode code_00;
  undefined6 in_register_00000032;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (__return_storage_ptr__->super_Headers).headers.
  super__Vector_base<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_Headers).headers.
  super__Vector_base<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_Headers).headers.
  super__Vector_base<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->content)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->content).field_2;
  (__return_storage_ptr__->content)._M_string_length = 0;
  (__return_storage_ptr__->content).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->statusCode = code;
  toString_abi_cxx11_(&local_c0,(Response *)CONCAT62(in_register_00000032,code),in_DX);
  ::std::operator+(&local_a0,"<html><head><title>",&local_c0);
  ::std::operator+(&local_e0,&local_a0,"</title></head>");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&__return_storage_ptr__->content,&local_e0);
  ::std::__cxx11::string::~string((string *)&local_e0);
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::to_string(&local_60,(uint)code);
  ::std::operator+(&local_40,"<body><h1>",&local_60);
  ::std::operator+(&local_c0,&local_40," ");
  toString_abi_cxx11_(&local_80,(Response *)(ulong)code,code_00);
  ::std::operator+(&local_a0,&local_c0,&local_80);
  ::std::operator+(&local_e0,&local_a0,"</h1></body></html>");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&__return_storage_ptr__->content,&local_e0);
  ::std::__cxx11::string::~string((string *)&local_e0);
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::__cxx11::string::~string((string *)&local_c0);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::to_string(&local_e0,(__return_storage_ptr__->content)._M_string_length);
  ::std::vector<webfront::http::Headers::Header,std::allocator<webfront::http::Headers::Header>>::
  emplace_back<char_const(&)[15],std::__cxx11::string>
            ((vector<webfront::http::Headers::Header,std::allocator<webfront::http::Headers::Header>>
              *)__return_storage_ptr__,(char (*) [15])"Content-Length",&local_e0);
  ::std::__cxx11::string::~string((string *)&local_e0);
  ::std::vector<webfront::http::Headers::Header,std::allocator<webfront::http::Headers::Header>>::
  emplace_back<char_const(&)[13],char_const(&)[10]>
            ((vector<webfront::http::Headers::Header,std::allocator<webfront::http::Headers::Header>>
              *)__return_storage_ptr__,(char (*) [13])"Content-Type",(char (*) [10])"text/html");
  return __return_storage_ptr__;
}

Assistant:

static Response getStatusResponse(StatusCode code) {
        Response response;
        response.statusCode = code;
        response.content = "<html><head><title>" + toString(code) + "</title></head>";
        response.content += "<body><h1>" + std::to_string(code) + " " + toString(code) + "</h1></body></html>";
        response.headers.emplace_back("Content-Length", std::to_string(response.content.size()));
        response.headers.emplace_back("Content-Type", "text/html");

        return response;
    }